

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

void __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>
::SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>
           *this,vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                 *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          unsigned_long batchSize,InnerRegisterSupplier *registerSupplier)

{
  pointer poVar1;
  uint uVar2;
  _Manager_type p_Var3;
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
  *pvVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_type sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 auVar19 [16];
  vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  frontLine;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currentFrontPointers;
  KeyValue<supermap::Key<4UL>,_unsigned_long> minItem;
  _Storage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true> local_f8;
  KeyValue<supermap::Key<4UL>,_unsigned_long> *local_e8;
  SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>
  *local_d8;
  size_type local_d0;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
  *local_c8;
  unsigned_long local_c0;
  vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  local_b8;
  path local_a0;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type local_60;
  KeyValue<supermap::Key<4UL>,_unsigned_long> local_58;
  shared_ptr<supermap::io::FileManager> local_48;
  pointer local_38;
  
  local_d8 = this;
  local_c0 = batchSize;
  std::filesystem::__cxx11::path::path(&local_a0,dataFileName,auto_format);
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_68 = (_Manager_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = registerSupplier->_M_invoker;
  p_Var3 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var3;
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  ::SingleFileIndexedStorage
            (&local_d8->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
             ,&local_a0,&local_48,(InnerRegisterSupplier *)&local_78);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  (local_d8->
  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  ).super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
  .super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>.
  _vptr_OrderedStorage = (_func_int **)&PTR_append_002019c0;
  (local_d8->
  super_Findable<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::Key<4UL>_>).
  _vptr_Findable = (_func_int **)&DAT_00201a08;
  pSVar4 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar15 = ((long)pSVar5 - (long)pSVar4 >> 3) * 0x6db6db6db6db6db7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,sVar15,
             (allocator_type *)&local_b8);
  local_e8 = (KeyValue<supermap::Key<4UL>,_unsigned_long> *)((ulong)local_e8 & 0xffffffffffffff00);
  std::
  vector<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
  ::vector(&local_b8,sVar15,(value_type *)&local_f8._M_value,(allocator_type *)&local_58);
  if (pSVar5 == pSVar4) {
    lVar17 = 0;
    local_d0 = sVar15;
  }
  else {
    lVar16 = sVar15 + (sVar15 == 0);
    lVar14 = 0x10;
    lVar18 = 0;
    lVar17 = 0;
    local_d0 = sVar15;
    do {
      pSVar4 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (**(code **)(*(long *)((long)&(pSVar4->
                                             super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                             ).
                                             super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                             .
                                             super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                             ._vptr_OrderedStorage + lVar18) + 8))
                         ((long)&(pSVar4->
                                 super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                 ).
                                 super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                 .
                                 super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                 ._vptr_OrderedStorage + lVar18);
      poVar1 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar11 != 0) {
        pSVar4 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        auVar19 = (**(code **)(*(long *)((long)&(pSVar4->
                                                super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                                ).
                                                super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                                .
                                                super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                                ._vptr_OrderedStorage + lVar18) + 0x20))
                            ((long)&(pSVar4->
                                    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                    ).
                                    super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                    .
                                    super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                    ._vptr_OrderedStorage + lVar18,0);
        if (*(char *)((long)&(poVar1->
                             super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                             )._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                             ._M_payload + lVar14) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar1->
                   super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                   )._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                   ._M_payload + lVar14) = 0;
        }
        *(long *)((long)poVar1 + lVar14 + -0x10) = auVar19._0_8_;
        *(long *)((long)poVar1 + lVar14 + -8) = auVar19._8_8_;
        *(undefined1 *)
         ((long)&(poVar1->
                 super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                 )._M_payload.
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                 ._M_payload + lVar14) = 1;
        pSVar4 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar11 = (**(code **)(*(long *)((long)&(pSVar4->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                               ._vptr_OrderedStorage + lVar18) + 8))
                           ((long)&(pSVar4->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                   .
                                   super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                   ._vptr_OrderedStorage + lVar18);
        lVar17 = lVar17 + lVar11;
      }
      lVar18 = lVar18 + 0x38;
      lVar14 = lVar14 + 0x18;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  (*(local_d8->
    super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    ).
    super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    .
    super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
    .register_.
    super_StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
    ._vptr_Cloneable[5])
            (&(local_d8->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
              .register_,lVar17);
  local_f8._0_8_ = (KeyValue<supermap::Key<4UL>,_unsigned_long> *)0x0;
  local_f8._M_value.value = 0;
  local_e8 = (KeyValue<supermap::Key<4UL>,_unsigned_long> *)0x0;
  std::
  vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
             *)&local_f8._M_value,local_c0);
  uVar10 = (int)local_d0 - 1;
  local_d0 = (size_type)uVar10;
  if (-1 < (int)uVar10) {
    uVar13 = 0;
    sVar15 = local_d0;
    local_c8 = newer;
    bVar8 = false;
    do {
      do {
        uVar12 = uVar13;
        bVar7 = bVar8;
        if ((local_b8.
             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar15].
             super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
             _M_engaged == true) && (uVar12 = sVar15, bVar7 = true, bVar8)) {
          if (local_b8.
              super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar13].
              super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
              _M_engaged == false) {
            std::__throw_bad_optional_access();
          }
          uVar10 = *(uint *)&local_b8.
                             super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[sVar15].
                             super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                             ._M_payload;
          uVar2 = *(uint *)&local_b8.
                            super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar13].
                            super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                            ._M_payload;
          bVar7 = bVar8;
          if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <=
               (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
              ) && (uVar12 = uVar13,
                   *&local_b8.
                     super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar15].
                     super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                     ._M_payload._M_value.key.super_array<unsigned_char,_4UL>._M_elems ==
                   *&local_b8.
                     super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].
                     super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                     ._M_payload._M_value.key.super_array<unsigned_char,_4UL>._M_elems)) {
            lVar17 = *(long *)(local_a0._M_pathname._M_dataplus._M_p + sVar15 * 8);
            *(ulong *)(local_a0._M_pathname._M_dataplus._M_p + sVar15 * 8) = lVar17 + 1U;
            pSVar4 = (newer->
                     super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar12 = (**(code **)(*(long *)&pSVar4[sVar15].
                                            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                            .
                                            super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                 + 8))(pSVar4 + sVar15);
            newer = local_c8;
            if (lVar17 + 1U < uVar12) {
              local_38 = local_b8.
                         super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pSVar4 = (local_c8->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              auVar19 = (**(code **)(*(long *)&pSVar4[sVar15].
                                               super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                               .
                                               super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                    + 0x20))
                                  (pSVar4 + sVar15,
                                   *(undefined8 *)
                                    (local_a0._M_pathname._M_dataplus._M_p + sVar15 * 8));
              *(long *)&local_38[sVar15].
                        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                        ._M_payload = auVar19._0_8_;
              local_38[sVar15].
              super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
              _M_payload._M_value.value = auVar19._8_8_;
              local_38[sVar15].
              super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
              _M_engaged = true;
              uVar12 = uVar13;
            }
            else {
              uVar12 = uVar13;
              if (local_b8.
                  super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar15].
                  super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                  ._M_engaged == true) {
                local_b8.
                super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar15].
                super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                ._M_engaged = false;
              }
            }
          }
        }
        pvVar9 = local_c8;
        bVar6 = 0 < (long)sVar15;
        uVar13 = uVar12;
        sVar15 = sVar15 - 1;
        bVar8 = bVar7;
      } while (bVar6);
      if (!bVar7) break;
      if (local_b8.
          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar12].
          super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
          _M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      poVar1 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar12;
      local_58.key.super_array<unsigned_char,_4UL>._M_elems =
           *(array<unsigned_char,_4UL> *)
            (poVar1->
            super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>)
            ._M_payload.
            super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
            _M_payload._M_value.key.super_array<unsigned_char,_4UL>._M_elems;
      local_58._4_4_ =
           *(undefined4 *)
            ((long)&(poVar1->
                    super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                    ._M_payload + 4);
      local_58.value._0_4_ =
           *(undefined4 *)
            ((long)&(poVar1->
                    super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                    ._M_payload + 8);
      local_58.value._4_4_ =
           *(undefined4 *)
            ((long)&(poVar1->
                    super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                    )._M_payload.
                    super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                    ._M_payload + 0xc);
      lVar14 = (long)(int)uVar12;
      lVar17 = *(long *)(local_a0._M_pathname._M_dataplus._M_p + lVar14 * 8);
      *(ulong *)(local_a0._M_pathname._M_dataplus._M_p + lVar14 * 8) = lVar17 + 1U;
      pSVar4 = (local_c8->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (**(code **)(*(long *)&pSVar4[lVar14].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                           + 8))(pSVar4 + lVar14);
      poVar1 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lVar17 + 1U < uVar13) {
        pSVar4 = (pvVar9->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void,_supermap::Key<4UL>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        auVar19 = (**(code **)(*(long *)&pSVar4[lVar14].
                                         super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                         .
                                         super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                                         .
                                         super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_unsigned_long,_void>
                              + 0x20))
                            (pSVar4 + lVar14,
                             *(undefined8 *)(local_a0._M_pathname._M_dataplus._M_p + lVar14 * 8));
        *(long *)&poVar1[lVar14].
                  super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>
                  ._M_payload = auVar19._0_8_;
        poVar1[lVar14].
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
        _M_payload._M_value.value = auVar19._8_8_;
        poVar1[lVar14].
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
        _M_engaged = true;
      }
      else if (local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar14].
               super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
               _M_engaged == true) {
        local_b8.
        super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar14].
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>.
        _M_engaged = false;
      }
      sVar15 = local_d0;
      if ((KeyValue<supermap::Key<4UL>,_unsigned_long> *)local_f8._M_value.value == local_e8) {
        std::
        vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>
        ::_M_realloc_insert<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>
                  ((vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>
                    *)&local_f8._M_value,(iterator)local_f8._M_value.value,&local_58);
      }
      else {
        *(array<unsigned_char,_4UL> *)local_f8._M_value.value =
             local_58.key.super_array<unsigned_char,_4UL>._M_elems;
        *(undefined4 *)(local_f8._M_value.value + 4) = local_58._4_4_;
        *(undefined4 *)(local_f8._M_value.value + 8) = (undefined4)local_58.value;
        *(undefined4 *)(local_f8._M_value.value + 0xc) = local_58.value._4_4_;
        local_f8._M_value.value = local_f8._M_value.value + 0x10;
      }
      if (local_c0 <= (ulong)((long)(local_f8._M_value.value - local_f8._0_8_) >> 4)) {
        SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
        ::
        appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,void>
                  ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
                    *)local_d8);
        if (local_f8._M_value.value != local_f8._0_8_) {
          local_f8._M_value.value = local_f8._0_8_;
        }
        std::
        vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
        ::reserve((vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
                   *)&local_f8._M_value,local_c0);
      }
      bVar8 = false;
      uVar13 = 0;
      newer = pvVar9;
    } while (-1 < (int)sVar15);
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
  ::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,unsigned_long>,unsigned_long,void>
              *)local_d8,local_f8._0_8_,local_f8._M_value.value);
  if (local_f8._M_value.value != local_f8._0_8_) {
    local_f8._M_value.value = local_f8._0_8_;
  }
  std::
  vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
  ::reserve((vector<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>
             *)&local_f8._M_value,local_c0);
  if ((KeyValue<supermap::Key<4UL>,_unsigned_long> *)local_f8._0_8_ !=
      (KeyValue<supermap::Key<4UL>,_unsigned_long> *)0x0) {
    operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
  }
  if (local_b8.
      super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>,_std::allocator<std::optional<supermap::KeyValue<supermap::Key<4UL>,_unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a0._M_pathname._M_dataplus._M_p,
                    local_a0._M_pathname.field_2._M_allocated_capacity -
                    (long)local_a0._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }